

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O2

Result dump_file(char *filename)

{
  pointer data;
  Result RVar1;
  Result RVar2;
  wabt *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  Enum EVar3;
  size_t size;
  bool bVar4;
  string_view filename_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ObjdumpState state;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(filename);
  filename_00._M_str = (char *)&file_data;
  filename_00._M_len = (size_t)filename;
  RVar1 = wabt::ReadFile(this,filename_00,in_RCX);
  data = file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    size = (long)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
    s_objdump_options.filename = filename;
    putchar(10);
    state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    state.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    state.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    state.code_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    state.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    state.data_relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header;
    state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header;
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    state.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    state.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.symtab.super__Vector_base<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    state.function_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &state.function_types._M_t._M_impl.super__Rb_tree_header._M_header;
    state.function_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    state.function_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    state.function_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    s_objdump_options.mode = Prepass;
    state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.type_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.function_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.global_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.section_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.tag_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.segment_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.table_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.local_names.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    state.function_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         state.function_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&state);
    bVar4 = RVar1.enum_ == Error;
    s_objdump_options.log_stream = (Stream *)0x0;
    if (s_objdump_options.headers == true) {
      s_objdump_options.mode = Headers;
      RVar2 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&state);
      bVar4 = RVar2.enum_ == Error || RVar1.enum_ == Error;
    }
    if (s_objdump_options.details == true) {
      s_objdump_options.mode = Details;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&state);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    if (s_objdump_options.disassemble == true) {
      s_objdump_options.mode = Disassemble;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&state);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    if (s_objdump_options.raw == true) {
      s_objdump_options.mode = RawData;
      RVar1 = wabt::ReadBinaryObjdump(data,size,&s_objdump_options,&state);
      bVar4 = (bool)(bVar4 | RVar1.enum_ == Error);
    }
    EVar3 = (Enum)bVar4;
    wabt::ObjdumpState::~ObjdumpState(&state);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (Result)EVar3;
}

Assistant:

Result dump_file(const char* filename) {
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(filename, &file_data));

  uint8_t* data = file_data.data();
  size_t size = file_data.size();

  // Perform serveral passed over the binary in order to print out different
  // types of information.
  s_objdump_options.filename = filename;
  printf("\n");

  ObjdumpState state;

  Result result = Result::Ok;

  // Pass 0: Prepass
  s_objdump_options.mode = ObjdumpMode::Prepass;
  result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  s_objdump_options.log_stream = nullptr;

  // Pass 1: Print the section headers
  if (s_objdump_options.headers) {
    s_objdump_options.mode = ObjdumpMode::Headers;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 2: Print extra information based on section type
  if (s_objdump_options.details) {
    s_objdump_options.mode = ObjdumpMode::Details;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 3: Disassemble code section
  if (s_objdump_options.disassemble) {
    s_objdump_options.mode = ObjdumpMode::Disassemble;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 4: Dump to raw contents of the sections
  if (s_objdump_options.raw) {
    s_objdump_options.mode = ObjdumpMode::RawData;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  return result;
}